

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void __thiscall BCLog::Logger::ShrinkDebugFile(Logger *this)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  void *__s;
  size_t sVar4;
  path *__filename;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_file_path).super_path._M_pathname._M_string_length == 0) {
    __assert_fail("!m_file_path.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x1d8,"void BCLog::Logger::ShrinkDebugFile()");
  }
  __filename = &this->m_file_path;
  __stream = fsbridge::fopen((char *)__filename,"r");
  uVar3 = std::filesystem::file_size((path *)__filename);
  if ((__stream == (FILE *)0x0) || (uVar3 < 0xa7d8c1)) {
    if (__stream == (FILE *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      fclose(__stream);
      return;
    }
    goto LAB_0040587a;
  }
  __s = operator_new(10000000);
  memset(__s,0,10000000);
  iVar2 = fseek(__stream,-10000000,2);
  if (iVar2 == 0) {
    sVar4 = fread(__s,1,10000000,__stream);
    fclose(__stream);
    __stream = fsbridge::fopen((char *)__filename,"w");
    if (__stream != (FILE *)0x0) {
      fwrite(__s,1,(long)(int)sVar4,__stream);
      goto LAB_0040579c;
    }
  }
  else {
    logging_function._M_str = "ShrinkDebugFile";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
    ;
    source_file._M_len = 0x5b;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x1ea,ALL,Info,(ConstevalFormatString<0U>)0x4e48a6);
LAB_0040579c:
    fclose(__stream);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(__s,10000000);
    return;
  }
LAB_0040587a:
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::ShrinkDebugFile()
{
    // Amount of debug.log to save at end when shrinking (must fit in memory)
    constexpr size_t RECENT_DEBUG_HISTORY_SIZE = 10 * 1000000;

    assert(!m_file_path.empty());

    // Scroll debug.log if it's getting too big
    FILE* file = fsbridge::fopen(m_file_path, "r");

    // Special files (e.g. device nodes) may not have a size.
    size_t log_size = 0;
    try {
        log_size = fs::file_size(m_file_path);
    } catch (const fs::filesystem_error&) {}

    // If debug.log file is more than 10% bigger the RECENT_DEBUG_HISTORY_SIZE
    // trim it down by saving only the last RECENT_DEBUG_HISTORY_SIZE bytes
    if (file && log_size > 11 * (RECENT_DEBUG_HISTORY_SIZE / 10))
    {
        // Restart the file with some of the end
        std::vector<char> vch(RECENT_DEBUG_HISTORY_SIZE, 0);
        if (fseek(file, -((long)vch.size()), SEEK_END)) {
            LogPrintf("Failed to shrink debug log file: fseek(...) failed\n");
            fclose(file);
            return;
        }
        int nBytes = fread(vch.data(), 1, vch.size(), file);
        fclose(file);

        file = fsbridge::fopen(m_file_path, "w");
        if (file)
        {
            fwrite(vch.data(), 1, nBytes, file);
            fclose(file);
        }
    }
    else if (file != nullptr)
        fclose(file);
}